

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O0

bool __thiscall
soplex::SPxFastRT<double>::minReLeave
          (SPxFastRT<double> *this,double *sel,int leave,double maxabs,bool polish)

{
  Status SVar1;
  UpdateVector<double> *this_00;
  double *pdVar2;
  byte in_CL;
  int in_EDX;
  double *in_RSI;
  long in_RDI;
  double in_XMM0_Qa;
  double dVar3;
  double x;
  VectorBase<double> *up;
  VectorBase<double> *low;
  UpdateVector<double> *vec;
  undefined8 in_stack_ffffffffffffff58;
  int iVar4;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  SPxId *in_stack_ffffffffffffff78;
  int i;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined8 in_stack_ffffffffffffff88;
  int i_00;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  bool local_1;
  
  i_00 = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  this_00 = SPxSolverBase<double>::fVec(*(SPxSolverBase<double> **)(in_RDI + 8));
  SPxSolverBase<double>::lbBound(*(SPxSolverBase<double> **)(in_RDI + 8));
  SPxSolverBase<double>::ubBound(*(SPxSolverBase<double> **)(in_RDI + 8));
  if (in_EDX < 0) {
    local_1 = true;
  }
  else {
    iVar4 = (int)((ulong)in_stack_ffffffffffffff58 >> 0x20);
    pdVar2 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)
                        CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),iVar4);
    dVar3 = *pdVar2;
    pdVar2 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)
                        CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),iVar4);
    if (dVar3 < *pdVar2 || dVar3 == *pdVar2) {
      *in_RSI = 0.0;
      if ((in_CL & 1) == 0) {
        iVar4 = (int)((ulong)*(undefined8 *)(in_RDI + 8) >> 0x20);
        VectorBase<double>::operator[]
                  ((VectorBase<double> *)CONCAT44(in_EDX,in_stack_ffffffffffffff60),iVar4);
        SPxSolverBase<double>::shiftLBbound
                  ((SPxSolverBase<double> *)
                   CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                   (double)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
        VectorBase<double>::operator[]
                  ((VectorBase<double> *)CONCAT44(in_EDX,in_stack_ffffffffffffff60),iVar4);
        SPxSolverBase<double>::shiftUBbound
                  ((SPxSolverBase<double> *)
                   CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),i_00,
                   (double)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      }
    }
    else {
      UpdateVector<double>::delta(this_00);
      dVar3 = SSVectorBase<double>::operator[]
                        ((SSVectorBase<double> *)
                         CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),iVar4);
      if ((*(double *)(in_RDI + 0x48) / in_XMM0_Qa < *in_RSI) && (*in_RSI = 0.0, (in_CL & 1) == 0))
      {
        SPxBasisBase<double>::baseId
                  ((SPxBasisBase<double> *)
                   CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),iVar4);
        SVar1 = SPxBasisBase<double>::dualStatus
                          ((SPxBasisBase<double> *)
                           CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                           in_stack_ffffffffffffff78);
        i = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
        if (SVar1 != D_ON_BOTH) {
          if (dVar3 <= 0.0) {
            VectorBase<double>::operator[]
                      ((VectorBase<double> *)
                       CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),iVar4);
            SPxSolverBase<double>::shiftUBbound
                      ((SPxSolverBase<double> *)
                       CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),i_00,
                       (double)CONCAT44(in_EDX,in_stack_ffffffffffffff80));
          }
          else {
            VectorBase<double>::operator[]
                      ((VectorBase<double> *)
                       CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),iVar4);
            SPxSolverBase<double>::shiftLBbound
                      ((SPxSolverBase<double> *)
                       CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),i,
                       (double)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
          }
        }
      }
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SPxFastRT<R>::minReLeave(R& sel, int leave, R maxabs, bool polish)
{
   UpdateVector<R>& vec = this->thesolver->fVec();
   VectorBase<R>& low = this->thesolver->lbBound();
   VectorBase<R>& up = this->thesolver->ubBound();

   if(leave < 0)
      return true;

   if(up[leave] > low[leave])
   {
      R x = vec.delta()[leave];

      if(sel > fastDelta / maxabs)
      {
         sel = 0.0;

         if(!polish
               && this->thesolver->dualStatus(this->thesolver->baseId(leave)) != SPxBasisBase<R>::Desc::D_ON_BOTH)
            // prevent shifts in polishing mode to avoid a final cleanup step (i.e. simplex type switch)
         {
            if(x > 0.0)
               this->thesolver->shiftLBbound(leave, vec[leave]);
            else
               this->thesolver->shiftUBbound(leave, vec[leave]);
         }
      }
   }
   else
   {
      sel = 0.0;

      // prevent shifts in polishing mode to avoid a final cleanup step (i.e. simplex type switch)
      if(!polish)
      {
         this->thesolver->shiftLBbound(leave, vec[leave]);
         this->thesolver->shiftUBbound(leave, vec[leave]);
      }
   }

   return false;
}